

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineInterpolationTestInstance *this)

{
  pointer pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float *pfVar3;
  deUint32 width;
  TestLog *log;
  undefined1 auVar4 [16];
  SceneLine *pSVar5;
  pointer pSVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  float *pfVar12;
  pointer pVVar13;
  ulong *puVar14;
  size_type *psVar15;
  LineInterpolationTestInstance *pLVar16;
  undefined8 uVar17;
  pointer pSVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined4 extraout_XMM0_Da;
  float fVar22;
  float extraout_XMM0_Da_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  string iterationDescription;
  ScopedLogSection section;
  Random rnd;
  SceneLine line;
  IVec4 colorBits;
  undefined1 local_2a8 [24];
  long lStack_290;
  LineInterpolationTestInstance *local_280;
  string local_278;
  undefined1 local_258 [40];
  TestStatus *local_230;
  undefined1 local_228 [32];
  string local_208;
  ScopedLogSection local_1e8;
  RasterizationArguments local_1dc;
  undefined1 local_1c8 [8];
  pointer pSStack_1c0;
  SceneLine local_1b8;
  ios_base local_158 [8];
  ios_base local_150 [272];
  tcu local_40 [8];
  int local_38;
  
  iVar9 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<((ostringstream *)local_1c8,iVar9 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb50840);
  pVVar1 = (pointer)(local_2a8 + 0x10);
  pVVar13 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pVVar13) {
    local_2a8._16_8_ = *(undefined8 *)pVVar13->m_data;
    lStack_290 = plVar10[3];
    local_2a8._0_8_ = pVVar1;
  }
  else {
    local_2a8._16_8_ = *(undefined8 *)pVVar13->m_data;
    local_2a8._0_8_ = (pointer)*plVar10;
  }
  local_2a8._8_8_ = plVar10[1];
  *plVar10 = (long)pVVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_2a8);
  paVar2 = &local_278.field_2;
  puVar14 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_278.field_2._M_allocated_capacity = *puVar14;
    local_278.field_2._8_8_ = plVar10[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar14;
    local_278._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_278._M_string_length = plVar10[1];
  *plVar10 = (long)puVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pSVar6 = (pointer)((long)((Vec4 *)local_258._8_8_)->m_data + local_278._M_string_length);
  uVar17 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    uVar17 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < pSVar6) {
    pSVar18 = (pointer)0xf;
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      pSVar18 = (pointer)local_258._16_8_;
    }
    if (pSVar6 <= pSVar18) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_258,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      goto LAB_007c9f5f;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,local_258._0_8_);
LAB_007c9f5f:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_208.field_2._M_allocated_capacity = *psVar15;
    local_208.field_2._8_8_ = puVar11[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar15;
    local_208._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_208._M_string_length = puVar11[1];
  *puVar11 = psVar15;
  puVar11[1] = 0;
  *(undefined1 *)psVar15 = 0;
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)((long)((Vec4 *)local_258._16_8_)->m_data + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2a8._0_8_ != pVVar1) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  iVar9 = this->m_iteration;
  local_280 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,iVar9 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0xb28e9c);
  pLVar16 = local_280;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_278.field_2._M_allocated_capacity = *psVar15;
    local_278.field_2._8_8_ = plVar10[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar15;
    local_278._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_278._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,&local_278,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2a8._0_8_ != pVVar1) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  (*(pLVar16->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(pLVar16);
  local_230 = (TestStatus *)CONCAT44(local_230._4_4_,extraout_XMM0_Da);
  width = (pLVar16->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_278,width,width);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (SceneLine *)0x0;
  local_258._8_8_ = (pointer)0x0;
  if (local_230._0_4_ <= pLVar16->m_maxLineWidth) {
    local_1c8 = (undefined1  [8])0x3f800000;
    pSStack_1c0 = (pointer)0x3f80000000000000;
    local_1b8.positions[0].m_data._0_8_ = (pointer)0x3f80000000000000;
    local_1b8.positions[0].m_data[2] = 0.0;
    local_1b8.positions[0].m_data[3] = 1.0;
    local_1b8.positions[1].m_data[0] = 0.0;
    local_1b8.positions[1].m_data[1] = 0.0;
    local_1b8.positions[1].m_data[2] = 1.0;
    local_1b8.positions[1].m_data[3] = 1.0;
    deRandom_init((deRandom *)&local_1dc,
                  pLVar16->m_iteration * 1000 + pLVar16->m_primitiveTopology + 0x7b);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,6
              );
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,6
              );
    local_230 = __return_storage_ptr__;
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
      lVar21 = 0;
      uVar19 = 0;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar19;
        fVar22 = deRandom_getFloat((deRandom *)&local_1dc);
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21) = fVar22 * 1.8 + -0.9;
        fVar22 = deRandom_getFloat((deRandom *)&local_1dc);
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 4) = fVar22 * 1.8 + -0.9;
        *(undefined4 *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) = 0;
        fVar22 = 1.0;
        if (pLVar16->m_projective == true) {
          fVar22 = deRandom_getFloat((deRandom *)&local_1dc);
          fVar22 = fVar22 * 3.8 + 0.2;
          uVar17 = *(undefined8 *)((long)(float *)local_2a8._0_8_ + lVar21);
          *(ulong *)((long)(float *)local_2a8._0_8_ + lVar21) =
               CONCAT44(fVar22 * (float)((ulong)uVar17 >> 0x20),fVar22 * (float)uVar17);
          *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) =
               *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) * fVar22;
        }
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 0xc) = fVar22;
        uVar17 = *(undefined8 *)
                  ((long)(local_1c8 +
                         lVar21 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                  0x1ffffffffffffffe) * -0x18) + 8);
        puVar11 = (undefined8 *)((long)(float *)local_228._0_8_ + lVar21);
        *puVar11 = *(undefined8 *)
                    (local_1c8 +
                    lVar21 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                             -0x18);
        puVar11[1] = uVar17;
        uVar19 = uVar19 + 1;
        lVar21 = lVar21 + 0x10;
      } while ((long)uVar19 < (long)(int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
    }
    if (pLVar16->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
      if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
        iVar9 = 0;
        do {
          lVar20 = (long)iVar9;
          local_1c8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + lVar20 * 0x10))->m_data;
          pSStack_1c0 = *(pointer *)(((pointer)(local_2a8._0_8_ + lVar20 * 0x10))->m_data + 2);
          local_1b8.positions[0].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data;
          local_1b8.positions[0].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data + 2);
          local_1b8.positions[1].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_228._0_8_ + lVar20 * 0x10))->m_data;
          local_1b8.positions[1].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_228._0_8_ + lVar20 * 0x10))->m_data + 2);
          lVar21 = (long)(iVar9 + 1);
          if (local_280->m_flatshade != false) {
            lVar21 = lVar20;
          }
          local_1b8.colors[0].m_data._0_8_ =
               *(undefined8 *)((pointer)(local_228._0_8_ + lVar21 * 0x10))->m_data;
          local_1b8.colors[0].m_data._8_8_ =
               *(undefined8 *)(((pointer)(local_228._0_8_ + lVar21 * 0x10))->m_data + 2);
          std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       *)local_258,(value_type *)local_1c8);
          iVar9 = iVar9 + 2;
        } while (iVar9 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1);
      }
    }
    else if ((pLVar16->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) &&
            (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1)) {
      lVar20 = 0;
      lVar21 = 0;
      do {
        puVar11 = (undefined8 *)((long)(float *)local_2a8._0_8_ + lVar20);
        local_1c8 = (undefined1  [8])*puVar11;
        pSStack_1c0 = (pointer)puVar11[1];
        pfVar3 = (float *)((long)((pointer)(local_2a8._0_8_ + 0x10))->m_data + lVar20);
        local_1b8.positions[0].m_data._0_8_ = *(undefined8 *)pfVar3;
        local_1b8.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar3 = (float *)((long)(float *)local_228._0_8_ + lVar20);
        local_1b8.positions[1].m_data._0_8_ = *(undefined8 *)pfVar3;
        local_1b8.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar3 + 2);
        pfVar12 = (float *)((long)(float *)local_228._0_8_ + lVar20);
        if (local_280->m_flatshade == false) {
          pfVar12 = pfVar3 + 4;
        }
        local_1b8.colors[0].m_data._0_8_ = *(undefined8 *)pfVar12;
        local_1b8.colors[0].m_data._8_8_ = *(undefined8 *)(pfVar12 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   *)local_258,(value_type *)local_1c8);
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x10;
      } while (lVar21 < (local_2a8._8_8_ - local_2a8._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
    local_1c8 = (undefined1  [8])
                ((local_280->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1c0,"Generated vertices:",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
    std::ios_base::~ios_base(local_150);
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
      lVar20 = 0;
      lVar21 = 0;
      do {
        local_1c8 = (undefined1  [8])
                    ((local_280->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                    m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,"\t",1);
        tcu::operator<<((ostream *)&pSStack_1c0,
                        (Vector<float,_4> *)((long)(float *)local_2a8._0_8_ + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,",\tcolor= ",9);
        tcu::operator<<((ostream *)&pSStack_1c0,
                        (Vector<float,_4> *)((long)(float *)local_228._0_8_ + lVar20));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
        std::ios_base::~ios_base(local_150);
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x10;
      } while (lVar21 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
    }
    pLVar16 = local_280;
    BaseRenderingTestInstance::drawPrimitives
              (&local_280->super_BaseRenderingTestInstance,(Surface *)&local_278,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
               local_280->m_primitiveTopology);
    __return_storage_ptr__ = local_230;
    local_1c8 = (undefined1  [8])0x0;
    pSStack_1c0 = (pointer)0x0;
    local_1b8.positions[0].m_data._0_8_ = (pointer)0x0;
    tcu::getTextureFormatBitDepth
              (local_40,&(pLVar16->super_BaseRenderingTestInstance).m_textureFormat);
    uVar17 = local_1b8.positions[0].m_data._0_8_;
    local_1dc.numSamples = (int)((pLVar16->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_1dc.subpixelBits = (pLVar16->super_BaseRenderingTestInstance).m_subpixelBits;
    local_1dc._8_8_ = local_40;
    local_1dc.blueBits = local_38;
    local_1b8.positions[0].m_data[0] = (float)local_258._16_4_;
    local_1b8.positions[0].m_data[1] = (float)local_258._20_4_;
    uVar7 = local_1b8.positions[0].m_data._0_8_;
    pSVar5 = (SceneLine *)local_258._0_8_;
    pSVar6 = (pointer)local_258._8_8_;
    local_258._0_8_ = local_1c8;
    local_258._8_8_ = pSStack_1c0;
    local_1b8.positions[0].m_data[0] = (float)uVar17;
    local_1b8.positions[0].m_data[1] = SUB84(uVar17,4);
    local_258._16_4_ = local_1b8.positions[0].m_data[0];
    local_258._20_4_ = local_1b8.positions[0].m_data[1];
    local_1c8 = (undefined1  [8])pSVar5;
    pSStack_1c0 = pSVar6;
    local_1b8.positions[0].m_data._0_8_ = uVar7;
    (*(pLVar16->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(pLVar16);
    local_1b8.positions[0].m_data[2] = extraout_XMM0_Da_00;
    bVar8 = tcu::verifyTriangulatedLineGroupInterpolation
                      ((Surface *)&local_278,(LineSceneSpec *)local_1c8,&local_1dc,
                       ((pLVar16->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar8) {
      pLVar16->m_allIterationsPassed = false;
    }
    if (local_1c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1c8,local_1b8.positions[0].m_data._0_8_ - (long)local_1c8);
    }
  }
  else {
    local_1c8 = (undefined1  [8])
                ((pLVar16->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1c0,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)local_230._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1c0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1c0);
    std::ios_base::~ios_base(local_150);
  }
  iVar9 = pLVar16->m_iteration + 1;
  pLVar16->m_iteration = iVar9;
  if (iVar9 == pLVar16->m_iterationCount) {
    if (pLVar16->m_allIterationsPassed == true) {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1c8,
                 (long)pSStack_1c0->positions[0].m_data + (long)((Vec4 *)local_1c8)->m_data);
    }
    else {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Incorrect rasterization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1c8,
                 (long)pSStack_1c0->positions[0].m_data + (long)((Vec4 *)local_1c8)->m_data);
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,
                      (ulong)((long)((Vec4 *)local_1b8.positions[0].m_data._0_8_)->m_data + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if ((SceneLine *)local_258._0_8_ != (SceneLine *)0x0) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ - local_258._0_8_);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  tcu::Surface::~Surface((Surface *)&local_278);
  tcu::TestLog::endSection(local_1e8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus LineInterpolationTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;

			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			if (!verifyTriangulatedLineGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}